

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O2

void nni_reap(nni_reap_list *rl,void *item)

{
  size_t sVar1;
  
  nni_mtx_lock(&reap_mtx);
  if (rl->rl_inited == false) {
    rl->rl_inited = true;
    rl->rl_next = reap_list;
    reap_list = rl;
  }
  reap_empty = 0;
  sVar1 = rl->rl_offset;
  *(nni_reap_node **)((long)item + sVar1) = rl->rl_nodes;
  rl->rl_nodes = (nni_reap_node *)((long)item + sVar1);
  nni_cv_wake1(&reap_work_cv);
  nni_mtx_unlock(&reap_mtx);
  return;
}

Assistant:

void
nni_reap(nni_reap_list *rl, void *item)
{
	nni_reap_node *node;

	nni_mtx_lock(&reap_mtx);
	if (!rl->rl_inited) {
		rl->rl_inited = true;
		rl->rl_next   = reap_list;
		reap_list     = rl;
	}
	reap_empty    = false;
	node          = (void *) ((char *) item + rl->rl_offset);
	node->rn_next = rl->rl_nodes;
	rl->rl_nodes  = node;
	nni_cv_wake1(&reap_work_cv);
	nni_mtx_unlock(&reap_mtx);
}